

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_views.cpp
# Opt level: O2

void populate_container(char_array_list *data,size_t element_count)

{
  buffer_t<char> *this;
  memory_resource *pmVar1;
  ulong uVar2;
  ulong uVar3;
  ushort *puVar4;
  long lVar5;
  ushort uVar6;
  ulong uVar7;
  char *new_buffer;
  size_t new_buffer_size;
  ulong local_78;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  sizes_t local_50;
  
  this = &(data->buffer_).v2_;
  uVar6 = 0;
  local_78 = element_count;
  while( true ) {
    uVar7 = (ulong)uVar6;
    if (local_78 <= uVar7) {
      printf("Created collection with %zu elements\n",local_78);
      return;
    }
    iffl::buffer_t<char>::validate(this);
    new_buffer = (char *)0x0;
    new_buffer_size = 0;
    deallocate_buffer.super_anon_class_24_3_566c83a5.buffer_size = &new_buffer_size;
    deallocate_buffer.armed_ = true;
    deallocate_buffer.super_anon_class_24_3_566c83a5.this =
         (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)data;
    deallocate_buffer.super_anon_class_24_3_566c83a5.buffer = &new_buffer;
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::get_all_sizes(&local_50,data);
    uVar3 = local_50.last_element.super_range.data_end + 1 & 0xfffffffffffffffe;
    uVar2 = 0;
    if (uVar3 <= local_50.total_capacity) {
      uVar2 = local_50.total_capacity - uVar3;
    }
    lVar5 = (uVar7 + 2) - uVar2;
    if (uVar7 + 2 < uVar2 || lVar5 == 0) {
      puVar4 = (ushort *)(this->begin + uVar3);
    }
    else {
      new_buffer_size = lVar5 + (local_50.total_capacity + 1 & 0xfffffffffffffffe);
      pmVar1 = (data->buffer_).v1_._M_resource;
      new_buffer = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,new_buffer_size,1);
      puVar4 = (ushort *)
               (new_buffer + (local_50.last_element.super_range.data_end + 1 & 0xfffffffffffffffe));
    }
    *puVar4 = uVar6;
    for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      *(char *)((long)puVar4 + uVar2 + 2) = (char)uVar6 + '\x01';
    }
    if (uVar6 < *puVar4) break;
    if (new_buffer != (char *)0x0) {
      if (this->begin != (pointer_type)0x0) {
        memcpy(new_buffer,this->begin,local_50.last_element.super_range.data_end);
      }
      iffl::
      flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
      ::commit_new_buffer(data,&new_buffer,&new_buffer_size);
    }
    (data->buffer_).v2_.last = (pointer_type)puVar4;
    iffl::buffer_t<char>::validate(this);
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::validate_data_invariants(data);
    iffl::
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
    ::discharge(&deallocate_buffer);
    uVar6 = uVar6 + 1;
  }
  std::terminate();
}

Assistant:

void populate_container(char_array_list &data, size_t element_count) noexcept {
    for (unsigned short idx = 0; idx < element_count; ++idx) {
        size_t element_size{ char_array_list::traits::minimum_size() + idx * sizeof(char_array_list::value_type::type) };
        data.emplace_back(element_size,
                          [&idx] (char_array_list_entry &e,
                                  size_t element_size) noexcept {
                              e.length = idx;
                              std::fill(e.arr, e.arr + e.length, static_cast<char>(idx)+1);
                          });
    }
    std::printf("Created collection with %zu elements\n", element_count);
}